

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeFenceCreatePrologue
          (ZEParameterValidation *this,ze_command_queue_handle_t hCommandQueue,ze_fence_desc_t *desc
          ,ze_fence_handle_t *phFence)

{
  ze_fence_handle_t *phFence_local;
  ze_fence_desc_t *desc_local;
  ze_command_queue_handle_t hCommandQueue_local;
  ZEParameterValidation *this_local;
  
  if (hCommandQueue == (ze_command_queue_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (desc == (ze_fence_desc_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (phFence == (ze_fence_handle_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (desc->flags < 2) {
    this_local._4_4_ = ParameterValidation::validateExtensions<_ze_fence_desc_t_const*>(desc);
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeFenceCreatePrologue(
        ze_command_queue_handle_t hCommandQueue,        ///< [in] handle of command queue
        const ze_fence_desc_t* desc,                    ///< [in] pointer to fence descriptor
        ze_fence_handle_t* phFence                      ///< [out] pointer to handle of fence object created
        )
    {
        if( nullptr == hCommandQueue )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phFence )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0x1 < desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }